

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_schnorrsig_challenge
               (secp256k1_scalar *e,uchar *r32,uchar *msg,size_t msglen,uchar *pubkey32)

{
  uchar buf [32];
  secp256k1_sha256 sha;
  
  secp256k1_schnorrsig_sha256_tagged(&sha);
  secp256k1_sha256_write(&sha,r32,0x20);
  secp256k1_sha256_write(&sha,pubkey32,0x20);
  secp256k1_sha256_write(&sha,msg,msglen);
  secp256k1_sha256_finalize(&sha,buf);
  secp256k1_scalar_set_b32(e,buf,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_schnorrsig_challenge(secp256k1_scalar* e, const unsigned char *r32, const unsigned char *msg, size_t msglen, const unsigned char *pubkey32)
{
    unsigned char buf[32];
    secp256k1_sha256 sha;

    /* tagged hash(r.x, pk.x, msg) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, r32, 32);
    secp256k1_sha256_write(&sha, pubkey32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, buf);
    /* Set scalar e to the challenge hash modulo the curve order as per
     * BIP340. */
    secp256k1_scalar_set_b32(e, buf, NULL);
}